

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

char * gflags::SetCommandLineOptionWithMode_abi_cxx11_
                 (char *name,char *value,FlagSettingMode set_mode)

{
  FlagRegistry *fr;
  CommandLineFlagParser local_d8 [32];
  undefined1 local_b8 [8];
  CommandLineFlagParser parser;
  CommandLineFlag *flag;
  FlagRegistryLock frl;
  FlagRegistry *registry;
  FlagSettingMode set_mode_local;
  char *value_local;
  char *name_local;
  string *result;
  
  std::__cxx11::string::string((string *)name);
  fr = anon_unknown_2::FlagRegistry::GlobalRegistry();
  anon_unknown_2::FlagRegistryLock::FlagRegistryLock((FlagRegistryLock *)&flag,fr);
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)anon_unknown_2::FlagRegistry::FindFlagLocked(fr,value);
  if ((CommandLineFlag *)parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (CommandLineFlag *)0x0) {
    anon_unknown_2::CommandLineFlagParser::CommandLineFlagParser
              ((CommandLineFlagParser *)local_b8,fr);
    (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
              (local_d8,(CommandLineFlag *)local_b8,
               (char *)parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               set_mode);
    std::__cxx11::string::operator=((string *)name,(string *)local_d8);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::empty();
    anon_unknown_2::CommandLineFlagParser::~CommandLineFlagParser((CommandLineFlagParser *)local_b8)
    ;
  }
  anon_unknown_2::FlagRegistryLock::~FlagRegistryLock((FlagRegistryLock *)&flag);
  return name;
}

Assistant:

string SetCommandLineOptionWithMode(const char* name, const char* value,
                                    FlagSettingMode set_mode) {
  string result;
  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  FlagRegistryLock frl(registry);
  CommandLineFlag* flag = registry->FindFlagLocked(name);
  if (flag) {
    CommandLineFlagParser parser(registry);
    result = parser.ProcessSingleOptionLocked(flag, value, set_mode);
    if (!result.empty()) {   // in the error case, we've already logged
      // Could consider logging this change
    }
  }
  // The API of this function is that we return empty string on error
  return result;
}